

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xpath_node_set::_move(xpath_node_set *this,xpath_node_set *rhs)

{
  xpath_node *local_28;
  xpath_node_set *rhs_local;
  xpath_node_set *this_local;
  
  this->_type = rhs->_type;
  this->_storage[0]._node._root = rhs->_storage[0]._node._root;
  this->_storage[0]._attribute._attr = rhs->_storage[0]._attribute._attr;
  if (rhs->_begin == rhs->_storage) {
    local_28 = this->_storage;
  }
  else {
    local_28 = rhs->_begin;
  }
  this->_begin = local_28;
  this->_end = this->_begin + ((long)rhs->_end - (long)rhs->_begin >> 4);
  rhs->_type = type_unsorted;
  rhs->_begin = rhs->_storage;
  rhs->_end = rhs->_storage;
  return;
}

Assistant:

PUGI__FN void xpath_node_set::_move(xpath_node_set& rhs) PUGIXML_NOEXCEPT
	{
		_type = rhs._type;
		_storage[0] = rhs._storage[0];
		_begin = (rhs._begin == rhs._storage) ? _storage : rhs._begin;
		_end = _begin + (rhs._end - rhs._begin);

		rhs._type = type_unsorted;
		rhs._begin = rhs._storage;
		rhs._end = rhs._storage;
	}